

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O2

void __thiscall
xLearn::ReaderTest_ReadFromBinary_Test::TestBody(ReaderTest_ReadFromBinary_Test *this)

{
  string ffm_no_file_comma;
  string lr_no_file_comma;
  string ffm_no_file;
  string lr_no_file;
  string csv_file_comma;
  string ffm_file_comma;
  string lr_file_comma;
  string csv_file;
  string ffm_file;
  string lr_file;
  
  std::operator+(&lr_file,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          kTestfilename_abi_cxx11_,"_LR.txt");
  std::operator+(&ffm_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm.txt");
  std::operator+(&csv_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_csv.txt");
  std::operator+(&lr_file_comma,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_LR_comma.txt");
  std::operator+(&ffm_file_comma,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm_comma.txt");
  std::operator+(&csv_file_comma,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_csv_comma.txt");
  std::operator+(&lr_no_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_LR_no.txt");
  std::operator+(&ffm_no_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm_no.txt");
  std::operator+(&lr_no_file_comma,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_LR_no_comma.txt");
  std::operator+(&ffm_no_file_comma,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kTestfilename_abi_cxx11_,"_ffm_no_comma.txt");
  read_from_memory(&lr_file,0);
  read_from_memory(&ffm_file,1);
  read_from_memory(&csv_file,2);
  read_from_memory(&lr_no_file,3);
  read_from_memory(&ffm_no_file,4);
  read_from_memory(&lr_file_comma,0);
  read_from_memory(&ffm_file_comma,1);
  read_from_memory(&csv_file_comma,2);
  read_from_memory(&lr_no_file_comma,3);
  read_from_memory(&ffm_no_file_comma,4);
  std::__cxx11::string::~string((string *)&ffm_no_file_comma);
  std::__cxx11::string::~string((string *)&lr_no_file_comma);
  std::__cxx11::string::~string((string *)&ffm_no_file);
  std::__cxx11::string::~string((string *)&lr_no_file);
  std::__cxx11::string::~string((string *)&csv_file_comma);
  std::__cxx11::string::~string((string *)&ffm_file_comma);
  std::__cxx11::string::~string((string *)&lr_file_comma);
  std::__cxx11::string::~string((string *)&csv_file);
  std::__cxx11::string::~string((string *)&ffm_file);
  std::__cxx11::string::~string((string *)&lr_file);
  return;
}

Assistant:

TEST(ReaderTest, ReadFromBinary) {
  // has label
  string lr_file = kTestfilename + "_LR.txt";
  string ffm_file = kTestfilename + "_ffm.txt";
  string csv_file = kTestfilename + "_csv.txt";
  string lr_file_comma = kTestfilename + "_LR_comma.txt";
  string ffm_file_comma = kTestfilename + "_ffm_comma.txt";
  string csv_file_comma = kTestfilename + "_csv_comma.txt";
  // has no label
  string lr_no_file = kTestfilename + "_LR_no.txt";
  string ffm_no_file = kTestfilename + "_ffm_no.txt";
  string lr_no_file_comma = kTestfilename + "_LR_no_comma.txt";
  string ffm_no_file_comma = kTestfilename + "_ffm_no_comma.txt";
  // check
  read_from_memory(lr_file, 0);
  read_from_memory(ffm_file, 1);
  read_from_memory(csv_file, 2);
  read_from_memory(lr_no_file, 3);
  read_from_memory(ffm_no_file, 4);
  read_from_memory(lr_file_comma, 0);
  read_from_memory(ffm_file_comma, 1);
  read_from_memory(csv_file_comma, 2);
  read_from_memory(lr_no_file_comma, 3);
  read_from_memory(ffm_no_file_comma, 4);  
}